

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManComputeForward2(Of_Man_t *p)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  Of_Obj_t *pOVar4;
  void **ppvVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  Gia_Man_t *pGVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint *puVar19;
  uint *pCut;
  uint *pCut_00;
  long lVar20;
  int local_48;
  
  pGVar10 = p->pGia;
  if (0 < pGVar10->nObjs) {
    lVar20 = 0;
    do {
      if (pGVar10->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar3 = *(undefined8 *)(pGVar10->pObjs + lVar20);
      uVar12 = (uint)uVar3;
      if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
        uVar12 = uVar12 & 0x1fffffff;
        if ((uVar12 == 0x1fffffff) || (uVar12 != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))) {
          if ((p->vCutSets).nSize <= lVar20) {
LAB_007991a4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar12 = (p->vCutSets).pArray[lVar20];
          uVar15 = (int)uVar12 >> 0x10;
          if (((int)uVar15 < 0) || (uVar16 = (p->vPages).nSize, (int)uVar16 <= (int)uVar15)) {
LAB_00799185:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pOVar4 = p->pObjs;
          iVar2 = pOVar4[lVar20].Required;
          ppvVar5 = (p->vPages).pArray;
          puVar19 = (uint *)((ulong)((uVar12 & 0xffff) << 2) + (long)ppvVar5[uVar15]);
          if (pOVar4[lVar20].nRefs == 0) {
            local_48 = 0;
          }
          else {
            if (lVar20 == 0) {
              __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                            ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
            }
            uVar12 = pOVar4[lVar20].iCutH >> 0x10;
            if (((int)uVar12 < 0) || (uVar16 <= uVar12)) goto LAB_00799185;
            local_48 = Of_CutDeref_rec(p,(int *)((ulong)((pOVar4[lVar20].iCutH & 0xffffU) << 2) +
                                                (long)ppvVar5[uVar12]));
          }
          if ((int)*puVar19 < 1) {
LAB_007991c3:
            __assert_fail("pCutMin != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x45c,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
          }
          pCut_00 = puVar19 + 1;
          iVar8 = 1000000000;
          pCut = (uint *)0x0;
          iVar13 = 0;
          do {
            uVar12 = *pCut_00 & 0x1f;
            uVar9 = (ulong)uVar12;
            if (uVar12 == 0) {
              uVar9 = 0;
              uVar15 = 0;
            }
            else {
              uVar14 = 0;
              uVar15 = 0;
              do {
                uVar16 = pCut_00[uVar14 + 1];
                if ((int)uVar16 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                if (uVar16 < 2) break;
                uVar16 = p->pObjs[uVar16 >> 1].Delay1 + p->pPars->nDelayLut1;
                if ((int)uVar15 <= (int)uVar16) {
                  uVar15 = uVar16;
                }
                uVar14 = uVar14 + 1;
              } while (uVar9 != uVar14);
            }
            pCut_00[uVar9 + 1] = uVar15;
            if ((int)uVar15 <= iVar2) {
              if ((p->vCutRefs).nSize != 0) {
                __assert_fail("Vec_IntSize(&p->vCutRefs) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                              ,0x440,"int Of_CutAreaDerefed2(Of_Man_t *, int *)");
              }
              iVar7 = Of_CutRef2_rec(p,(int *)pCut_00);
              lVar11 = (long)(p->vCutRefs).nSize;
              if (0 < lVar11) {
                piVar6 = (p->vCutRefs).pArray;
                pOVar4 = p->pObjs;
                lVar17 = 0;
                do {
                  piVar1 = &pOVar4[piVar6[lVar17]].nRefs;
                  *piVar1 = *piVar1 + -1;
                  lVar17 = lVar17 + 1;
                } while (lVar11 != lVar17);
              }
              (p->vCutRefs).nSize = 0;
              iVar18 = iVar8;
              if (iVar7 <= iVar8) {
                iVar18 = iVar7;
              }
              if (iVar7 < iVar8) {
                pCut = pCut_00;
              }
              uVar12 = *pCut_00 & 0x1f;
              iVar8 = iVar18;
            }
            iVar13 = iVar13 + 1;
            pCut_00 = pCut_00 + (ulong)uVar12 + 4;
          } while (iVar13 < (int)*puVar19);
          if (pCut == (uint *)0x0) goto LAB_007991c3;
          if ((p->vCutSets).nSize <= lVar20) goto LAB_007991a4;
          if (pCut < puVar19 || (long)pCut - (long)puVar19 == 0) {
            __assert_fail("pCut > pCutSet",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x6c,"int Of_CutHandle(int *, int *)");
          }
          pOVar4 = p->pObjs;
          pOVar4[lVar20].iCutH =
               (int)((ulong)((long)pCut - (long)puVar19) >> 2) + (p->vCutSets).pArray[lVar20];
          if (pOVar4[lVar20].nRefs == 0) {
            iVar8 = 0;
          }
          else {
            iVar8 = Of_CutRef_rec(p,(int *)pCut);
          }
          if (local_48 < iVar8) {
            __assert_fail("AreaAft <= AreaBef",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x460,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
          }
          if (iVar2 < (int)pCut[(ulong)(*pCut & 0x1f) + 1]) {
            __assert_fail("Delay <= Required",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x462,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
          }
          p->pObjs[lVar20].Delay1 = pCut[(ulong)(*pCut & 0x1f) + 1];
          pGVar10 = p->pGia;
        }
        else {
          p->pObjs[lVar20].Delay1 = p->pObjs[(int)((int)lVar20 - uVar12)].Delay1;
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < pGVar10->nObjs);
  }
  return;
}

Assistant:

void Of_ManComputeForward2( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Of_ObjSetDelay1( p, i, Of_ObjDelay1(p, Gia_ObjFaninId0(pObj, i)) );
        else
            Of_ManComputeForwardObj2( p, i );
}